

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fits_get_section_range(char **ptr,long *secmin,long *secmax,long *incre,int *status)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  int isanumber;
  char *tstbuff;
  char token [71];
  int local_8c;
  char *local_88;
  long *local_80;
  char local_78 [72];
  
  local_88 = (char *)0x0;
  if (0 < *status) {
    return *status;
  }
  local_80 = incre;
  iVar2 = fits_get_token2(ptr," ,:",&local_88,&local_8c,status);
  pcVar5 = local_88;
  if (iVar2 == 0) {
    local_78[0] = '*';
    local_78[1] = '\0';
LAB_0011dd2f:
    if (local_78[0] == '*') {
      *secmin = 1;
      lVar4 = 0;
LAB_0011dd61:
      *secmax = lVar4;
      lVar4 = 1;
      if (**ptr != ':') {
LAB_0011debd:
        *local_80 = lVar4;
        if (**ptr == ',') {
          *ptr = *ptr + 1;
        }
        pcVar5 = *ptr;
        cVar1 = *pcVar5;
        while (cVar1 == ' ') {
          pcVar5 = pcVar5 + 1;
          *ptr = pcVar5;
          cVar1 = *pcVar5;
        }
        if ((*secmin < 0) || (lVar4 < 1 || *secmax < 0)) {
          *status = 0x7d;
        }
        return *status;
      }
      *ptr = *ptr + 1;
      iVar2 = fits_get_token2(ptr," ,",&local_88,&local_8c,status);
      pcVar5 = local_88;
      if ((iVar2 != 0) && (local_8c != 0)) {
        sVar3 = strlen(local_88);
        if (sVar3 < 0x47) {
          strcpy(local_78,pcVar5);
          free(pcVar5);
          local_88 = (char *)0x0;
          lVar4 = atol(local_78);
          goto LAB_0011debd;
        }
LAB_0011ddc5:
        ffpmsg("Error: image section string too long (fits_get_section_range)");
        goto LAB_0011de82;
      }
    }
    else {
      if ((local_78[0] == '-') && (local_78[1] == '*')) {
        *secmin = 0;
        lVar4 = 1;
        goto LAB_0011dd61;
      }
      if (((iVar2 == 0) || (local_8c == 0)) || (pcVar5 = *ptr, *pcVar5 != ':')) goto LAB_0011de87;
      lVar4 = atol(local_78);
      *secmin = lVar4;
      *ptr = pcVar5 + 1;
      iVar2 = fits_get_token2(ptr," ,:",&local_88,&local_8c,status);
      pcVar5 = local_88;
      if ((iVar2 != 0) && (local_8c != 0)) {
        sVar3 = strlen(local_88);
        if (sVar3 < 0x47) {
          strcpy(local_78,pcVar5);
          free(pcVar5);
          local_88 = (char *)0x0;
          lVar4 = atol(local_78);
          goto LAB_0011dd61;
        }
        goto LAB_0011ddc5;
      }
    }
    pcVar5 = local_88;
    if (local_88 == (char *)0x0) goto LAB_0011de87;
  }
  else {
    sVar3 = strlen(local_88);
    if (sVar3 < 0x47) {
      strcpy(local_78,pcVar5);
      free(pcVar5);
      local_88 = (char *)0x0;
      goto LAB_0011dd2f;
    }
    ffpmsg("Error: image section string too long (fits_get_section_range)");
  }
LAB_0011de82:
  free(pcVar5);
LAB_0011de87:
  *status = 0x7d;
  return 0x7d;
}

Assistant:

int fits_get_section_range(char **ptr, 
                   long *secmin,
                   long *secmax, 
                   long *incre,
                   int *status)
/*
   Parse the input image section specification string, returning 
   the  min, max and increment values.
   Typical string =   "1:512:2"  or "1:512"
*/
{
    int slen, isanumber;
    char token[FLEN_VALUE], *tstbuff=0;

    if (*status > 0)
        return(*status);

    slen = fits_get_token2(ptr, " ,:", &tstbuff, &isanumber, status); /* get 1st token */
    if (slen==0)
    {
       /* support [:2,:2] type syntax, where the leading * is implied */
       strcpy(token,"*");
    }
    else
    {
       if (strlen(tstbuff) > FLEN_VALUE-1)
       {
          ffpmsg("Error: image section string too long (fits_get_section_range)");
          free(tstbuff);
          *status = URL_PARSE_ERROR;
          return(*status);
       }
       strcpy(token, tstbuff);
       free(tstbuff);
       tstbuff=0;
    }

    if (*token == '*')  /* wild card means to use the whole range */
    {
       *secmin = 1;
       *secmax = 0;
    }
    else if (*token == '-' && *(token+1) == '*' )  /* invert the whole range */
    {
       *secmin = 0;
       *secmax = 1;
    }
    else
    {
      if (slen == 0 || !isanumber || **ptr != ':')
        return(*status = URL_PARSE_ERROR);   

      /* the token contains the min value */
      *secmin = atol(token);

      (*ptr)++;  /* skip the colon between the min and max values */
      slen = fits_get_token2(ptr, " ,:", &tstbuff, &isanumber, status); /* get token */
      if (slen == 0 || !isanumber)
      {
        if (tstbuff)
           free(tstbuff);
        return(*status = URL_PARSE_ERROR);  
      } 
      if (strlen(tstbuff) > FLEN_VALUE-1)
      {
         ffpmsg("Error: image section string too long (fits_get_section_range)");
         free(tstbuff);
         *status = URL_PARSE_ERROR;
         return(*status);
      }
      strcpy(token, tstbuff);
      free(tstbuff);
      tstbuff=0;

      /* the token contains the max value */
      *secmax = atol(token);
    }

    if (**ptr == ':')
    {
        (*ptr)++;  /* skip the colon between the max and incre values */
        slen = fits_get_token2(ptr, " ,", &tstbuff, &isanumber, status); /* get token */
        if (slen == 0 || !isanumber)
        {
            if (tstbuff)
               free(tstbuff);
            return(*status = URL_PARSE_ERROR); 
        }  
        if (strlen(tstbuff) > FLEN_VALUE-1)
        {
           ffpmsg("Error: image section string too long (fits_get_section_range)");
           free(tstbuff);
           *status = URL_PARSE_ERROR;
           return(*status);
        }
        strcpy(token, tstbuff);
        free(tstbuff);
        tstbuff=0;


        *incre = atol(token);
    }
    else
        *incre = 1;  /* default increment if none is supplied */

    if (**ptr == ',')
        (*ptr)++;

    while (**ptr == ' ')   /* skip any trailing blanks */
         (*ptr)++;

    if (*secmin < 0 || *secmax < 0 || *incre < 1)
        *status = URL_PARSE_ERROR;

    return(*status);
}